

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

void __thiscall testing::internal::MutexBase::Unlock(MutexBase *this)

{
  int iVar1;
  GTestLog local_c;
  
  this->has_owner_ = false;
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/build_O1/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x66d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_mutex_unlock(&mutex_)",0x1d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    GTestLog::~GTestLog(&local_c);
  }
  return;
}

Assistant:

void Unlock() {
    // Since the lock is being released the owner_ field should no longer be
    // considered valid. We don't protect writing to has_owner_ here, as it's
    // the caller's responsibility to ensure that the current thread holds the
    // mutex when this is called.
    has_owner_ = false;
    GTEST_CHECK_POSIX_SUCCESS_(pthread_mutex_unlock(&mutex_));
  }